

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interpreter.c
# Opt level: O1

char * parse_ld_trace_line_path(char *line)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *pcVar3;
  
  pcVar1 = strstr(line,"=> ");
  if (pcVar1 == (char *)0x0) {
    if (line == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      ppuVar2 = __ctype_b_loc();
      pcVar1 = line + -1;
      do {
        pcVar3 = pcVar1 + 1;
        pcVar1 = pcVar1 + 1;
      } while ((*(byte *)((long)*ppuVar2 + (long)*pcVar3 * 2 + 1) & 0x20) != 0);
    }
  }
  else {
    pcVar1 = pcVar1 + 3;
  }
  pcVar3 = strstr(pcVar1," (");
  if (pcVar3 == (char *)0x0) {
    pcVar1 = strdup(pcVar1);
    return pcVar1;
  }
  pcVar1 = strndup(pcVar1,(long)pcVar3 - (long)pcVar1);
  return pcVar1;
}

Assistant:

char *parse_ld_trace_line_path(const char *line) {
    char *path = NULL;
    const char *path_start = strstr(line, "=> ");
    if (path_start != NULL) {
        path_start += 3;
    } else {
        path_start = line;
        while (path_start != NULL && isspace(*path_start))
            path_start++;
    }

    char *path_end = strstr(path_start, " (");

    if (path_end != NULL)
        path = strndup(path_start, path_end - path_start);
    else
        path = strdup(path_start);


    return path;
}